

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O3

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::EndList(AnyWriter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  ProtoStreamObjectWriter *pPVar4;
  LogMessage *other;
  Event local_98;
  LogFinisher local_21;
  
  iVar3 = this->depth_;
  this->depth_ = iVar3 + -1;
  if (iVar3 < 1) {
    protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/util/internal/protostream_objectwriter.cc"
               ,0x119);
    other = protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)&local_98,"Mismatched EndList found, should not be possible");
    protobuf::internal::LogFinisher::operator=(&local_21,other);
    protobuf::internal::LogMessage::~LogMessage((LogMessage *)&local_98);
    this->depth_ = 0;
  }
  pPVar4 = (this->ow_)._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
           ._M_head_impl;
  if (pPVar4 == (ProtoStreamObjectWriter *)0x0) {
    paVar1 = &local_98.name_.field_2;
    local_98.type_ = END_LIST;
    local_98.name_._M_string_length = 0;
    local_98.name_.field_2._M_local_buf[0] = '\0';
    local_98.value_._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
    local_98.value_.type_ = TYPE_NULL;
    local_98.value_.field_2.i32_ = 0;
    local_98.value_.use_strict_base64_decoding_ = false;
    paVar2 = &local_98.value_storage_.field_2;
    local_98.value_storage_._M_string_length = 0;
    local_98.value_storage_.field_2._M_local_buf[0] = '\0';
    local_98.name_._M_dataplus._M_p = (pointer)paVar1;
    local_98.value_storage_._M_dataplus._M_p = (pointer)paVar2;
    std::
    vector<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
    ::emplace_back<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>
              (&this->uninterpreted_events_,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value_storage_._M_dataplus._M_p != paVar2) {
      operator_delete(local_98.value_storage_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.name_._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.name_._M_dataplus._M_p);
    }
  }
  else {
    (**(code **)(*(long *)&(pPVar4->super_ProtoWriter).super_StructuredObjectWriter + 0x28))();
  }
  return;
}

Assistant:

void ProtoStreamObjectWriter::AnyWriter::EndList() {
  --depth_;
  if (depth_ < 0) {
    GOOGLE_LOG(DFATAL) << "Mismatched EndList found, should not be possible";
    depth_ = 0;
  }
  if (ow_ == nullptr) {
    // Save data before the "@type" field for later replay.
    uninterpreted_events_.push_back(Event(Event::END_LIST));
  } else {
    ow_->EndList();
  }
}